

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int is_wifi(int sock_fd,char *device)

{
  int iVar1;
  char local_1b8 [8];
  char errbuf [256];
  undefined1 local_b0 [8];
  stat statb;
  char *pathstr;
  char *device_local;
  int sock_fd_local;
  
  iVar1 = asprintf((char **)(statb.__glibc_reserved + 2),"/sys/class/net/%s/wireless",device);
  if (iVar1 == -1) {
    device_local._4_4_ = 0;
  }
  else {
    iVar1 = stat((char *)statb.__glibc_reserved[2],(stat *)local_b0);
    if (iVar1 == 0) {
      free((void *)statb.__glibc_reserved[2]);
      device_local._4_4_ = 1;
    }
    else {
      free((void *)statb.__glibc_reserved[2]);
      iVar1 = has_wext(sock_fd,device,local_1b8);
      if (iVar1 == 1) {
        device_local._4_4_ = 1;
      }
      else {
        device_local._4_4_ = 0;
      }
    }
  }
  return device_local._4_4_;
}

Assistant:

static int
is_wifi(int sock_fd
#ifndef IW_MODE_MONITOR
_U_
#endif
, const char *device)
{
	char *pathstr;
	struct stat statb;
#ifdef IW_MODE_MONITOR
	char errbuf[PCAP_ERRBUF_SIZE];
#endif

	/*
	 * See if there's a sysfs wireless directory for it.
	 * If so, it's a wireless interface.
	 */
	if (asprintf(&pathstr, "/sys/class/net/%s/wireless", device) == -1) {
		/*
		 * Just give up here.
		 */
		return 0;
	}
	if (stat(pathstr, &statb) == 0) {
		free(pathstr);
		return 1;
	}
	free(pathstr);

#ifdef IW_MODE_MONITOR
	/*
	 * OK, maybe it's not wireless, or maybe this kernel doesn't
	 * support sysfs.  Try the wireless extensions.
	 */
	if (has_wext(sock_fd, device, errbuf) == 1) {
		/*
		 * It supports the wireless extensions, so it's a Wi-Fi
		 * device.
		 */
		return 1;
	}
#endif
	return 0;
}